

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

bool __thiscall Minisat::Solver::propagateLit(Solver *this,Lit l,vec<Minisat::Lit> *implied)

{
  byte bVar1;
  int iVar2;
  CRef CVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  int local_2c;
  
  cancelUntil(this,0,false);
  if (implied->data != (Lit *)0x0) {
    implied->sz = 0;
  }
  bVar1 = (this->assigns).data[l.x >> 1].value;
  if ((bVar1 & 2) == 0) {
    bVar6 = (bVar1 ^ (byte)l.x & 1) == 1;
  }
  else {
    local_2c = (this->trail).sz;
    vec<int>::push(&this->trail_lim,&local_2c);
    uncheckedEnqueue(this,l,(this->trail_lim).sz,0xffffffff);
    iVar2 = (this->trail).sz;
    lVar5 = (long)iVar2;
    CVar3 = propagate(this);
    bVar6 = CVar3 != 0xffffffff;
    if (iVar2 < (this->trail).sz) {
      lVar4 = lVar5 * 4;
      do {
        vec<Minisat::Lit>::push(implied,(Lit *)((long)&((this->trail).data)->x + lVar4));
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 4;
      } while (lVar5 < (this->trail).sz);
    }
    cancelUntil(this,0,false);
  }
  return bVar6;
}

Assistant:

bool Solver::propagateLit(Lit l, vec<Lit> &implied)
{
    cancelUntil(0);
    implied.clear();
    bool conflict = false;

    // literal is a unit clause
    if (value(l) != l_Undef) {
        return value(l) == l_False;
    }
    assert(value(l) == l_Undef);

    // propagate on a new decision level, to be able to roll back
    newDecisionLevel();
    uncheckedEnqueue(l, decisionLevel(), CRef_Undef);

    // collect trail literals
    int pre_size = trail.size();
    CRef cr = propagate();
    if (cr != CRef_Undef) conflict = true;
    for (int i = pre_size; i < trail.size(); i++) {
        implied.push(trail[i]);
    }
    cancelUntil(0);

    return conflict;
}